

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# join_hashtable.cpp
# Opt level: O2

void __thiscall duckdb::JoinHashTable::Merge(JoinHashTable *this,JoinHashTable *other)

{
  pointer this_00;
  type other_00;
  pointer this_01;
  type other_01;
  pointer this_02;
  type other_02;
  bool bVar1;
  
  ::std::mutex::lock(&this->data_lock);
  this_00 = unique_ptr<duckdb::TupleDataCollection,_std::default_delete<duckdb::TupleDataCollection>,_true>
            ::operator->(&this->data_collection);
  other_00 = unique_ptr<duckdb::TupleDataCollection,_std::default_delete<duckdb::TupleDataCollection>,_true>
             ::operator*(&other->data_collection);
  TupleDataCollection::Combine(this_00,other_00);
  pthread_mutex_unlock((pthread_mutex_t *)&this->data_lock);
  if (this->join_type == MARK) {
    ::std::mutex::lock(&(this->correlated_mark_join_info).mj_lock);
    bVar1 = true;
    if (this->has_null == false) {
      bVar1 = other->has_null;
    }
    this->has_null = bVar1;
    if ((this->correlated_mark_join_info).correlated_types.
        super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
        super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
        super__Vector_impl_data._M_start !=
        (this->correlated_mark_join_info).correlated_types.
        super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
        super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      this_01 = unique_ptr<duckdb::GroupedAggregateHashTable,_std::default_delete<duckdb::GroupedAggregateHashTable>,_true>
                ::operator->(&(this->correlated_mark_join_info).correlated_counts);
      other_01 = unique_ptr<duckdb::GroupedAggregateHashTable,_std::default_delete<duckdb::GroupedAggregateHashTable>,_true>
                 ::operator*(&(other->correlated_mark_join_info).correlated_counts);
      GroupedAggregateHashTable::Combine(this_01,other_01);
    }
    pthread_mutex_unlock((pthread_mutex_t *)&this->correlated_mark_join_info);
  }
  this_02 = unique_ptr<duckdb::PartitionedTupleData,_std::default_delete<duckdb::PartitionedTupleData>,_true>
            ::operator->(&this->sink_collection);
  other_02 = unique_ptr<duckdb::PartitionedTupleData,_std::default_delete<duckdb::PartitionedTupleData>,_true>
             ::operator*(&other->sink_collection);
  PartitionedTupleData::Combine(this_02,other_02);
  return;
}

Assistant:

void JoinHashTable::Merge(JoinHashTable &other) {
	{
		lock_guard<mutex> guard(data_lock);
		data_collection->Combine(*other.data_collection);
	}

	if (join_type == JoinType::MARK) {
		auto &info = correlated_mark_join_info;
		lock_guard<mutex> mj_lock(info.mj_lock);
		has_null = has_null || other.has_null;
		if (!info.correlated_types.empty()) {
			auto &other_info = other.correlated_mark_join_info;
			info.correlated_counts->Combine(*other_info.correlated_counts);
		}
	}

	sink_collection->Combine(*other.sink_collection);
}